

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::UniformType::streamArrayStr
          (UniformType *this,ostringstream *_str,int arrayElem)

{
  size_type sVar1;
  ostream *poVar2;
  const_reference pvVar3;
  ulong local_38;
  size_t segment_1;
  ulong uStack_28;
  int tailSize;
  size_t segment;
  int arrayElem_local;
  ostringstream *_str_local;
  UniformType *this_local;
  
  if ((this->isArray & 1U) != 0) {
    if (arrayElem < 0) {
      for (uStack_28 = 0;
          sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->arraySizesSegmented),
          uStack_28 < sVar1; uStack_28 = uStack_28 + 1) {
        poVar2 = std::operator<<(&_str->super_basic_ostream<char,_std::char_traits<char>_>,"[");
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->arraySizesSegmented,uStack_28);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar3);
        std::operator<<(poVar2,"]");
      }
    }
    else {
      segment_1._4_4_ = this->arraySize;
      segment._4_4_ = arrayElem;
      for (local_38 = 0;
          sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->arraySizesSegmented),
          local_38 < sVar1; local_38 = local_38 + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->arraySizesSegmented,local_38);
        segment_1._4_4_ = segment_1._4_4_ / *pvVar3;
        poVar2 = std::operator<<(&_str->super_basic_ostream<char,_std::char_traits<char>_>,"[");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,segment._4_4_ / segment_1._4_4_);
        std::operator<<(poVar2,"]");
        segment._4_4_ = segment._4_4_ % segment_1._4_4_;
      }
    }
  }
  return;
}

Assistant:

void streamArrayStr(std::ostringstream& _str, int arrayElem = -1) const
	{
		if (!isArray)
		{
			return;
		}
		if (arrayElem < 0)
		{
			for (size_t segment = 0; segment < arraySizesSegmented.size(); segment++)
			{
				_str << "[" << arraySizesSegmented[segment] << "]";
			}
		}
		else
		{
			int tailSize = arraySize;
			for (size_t segment = 0; segment < arraySizesSegmented.size(); segment++)
			{
				tailSize /= arraySizesSegmented[segment];
				_str << "[" << arrayElem / tailSize << "]";
				arrayElem %= tailSize;
			}
		}
	}